

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

void enet_peer_ping(ENetPeer *peer)

{
  ENetProtocol command;
  ENetProtocol local_32;
  
  if (peer->state == ENET_PEER_STATE_CONNECTED) {
    local_32._0_2_ = 0xff85;
    enet_peer_queue_outgoing_command(peer,&local_32,(ENetPacket *)0x0,0,0);
  }
  return;
}

Assistant:

void
enet_peer_ping (ENetPeer * peer)
{
    ENetProtocol command;

    if (peer -> state != ENET_PEER_STATE_CONNECTED)
      return;

    command.header.command = ENET_PROTOCOL_COMMAND_PING | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
   
    enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
}